

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_tree.cc
# Opt level: O3

uint32_t __thiscall IndexTree::allocateNode(IndexTree *this)

{
  size_t __len;
  uint uVar1;
  int iVar2;
  void *__addr;
  uint *puVar3;
  
  puVar3 = this->node_count;
  uVar1 = *puVar3;
  if (this->current_capacity <= uVar1) {
    iVar2 = ftruncate(this->index_file_fd,this->index_file_size * 2);
    if (iVar2 != 0) {
      __assert_fail("ret == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/engine_race/index_tree.cc"
                    ,0xe9,"uint32_t IndexTree::allocateNode()");
    }
    __addr = mremap(this->file_map,this->index_file_size,this->index_file_size * 2,1);
    this->file_map = __addr;
    if (__addr == (void *)0xffffffffffffffff) {
      __assert_fail("file_map != MAP_FAILED",
                    "/workspace/llm4binary/github/license_c_cmakelists/Harry-Chen[P]TrivialKV/engine_race/index_tree.cc"
                    ,0xeb,"uint32_t IndexTree::allocateNode()");
    }
    __len = this->index_file_size * 2;
    this->index_file_size = __len;
    this->current_capacity = ((int)__len - 8U) / 0x41c;
    madvise(__addr,__len,1);
    puVar3 = (uint *)this->file_map;
    this->node_count = puVar3;
    this->root_node = (int32_t *)(puVar3 + 1);
    this->nodes = (Node *)(puVar3 + 2);
    uVar1 = *puVar3;
  }
  *puVar3 = uVar1 + 1;
  return uVar1;
}

Assistant:

uint32_t IndexTree::allocateNode() {
    if (__glibc_unlikely(*node_count >= current_capacity)) {
//        printf("Re-mapping index file to extend size\n");
        // extend the index file size
        int ret = ftruncate(index_file_fd, index_file_size * 2);
        assert(ret == 0);
        file_map = mremap(file_map, index_file_size, index_file_size * 2, MREMAP_MAYMOVE);
        assert(file_map != MAP_FAILED);
        index_file_size *= 2;
        current_capacity = (uint32_t) (index_file_size - 2 * sizeof(uint32_t)) / sizeof(Node);
        initFileMap();
    }
    *node_count += 1;
    return *node_count - 1;
}